

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClrDirWrapper.cpp
# Opt level: O0

QString * ClrDirWrapper::translateFlag(QString *__return_storage_ptr__,DWORD flags)

{
  DWORD flags_local;
  
  if ((flags & 1) == 0) {
    if ((flags & 2) == 0) {
      if ((flags & 4) == 0) {
        if ((flags & 8) == 0) {
          if ((flags & 0x10) == 0) {
            if ((flags & 0x10000) == 0) {
              QString::QString(__return_storage_ptr__,"");
            }
            else {
              QString::QString(__return_storage_ptr__,"Track Debug Data");
            }
          }
          else {
            QString::QString(__return_storage_ptr__,"Native EntryPoint");
          }
        }
        else {
          QString::QString(__return_storage_ptr__,"Strong Name Signed");
        }
      }
      else {
        QString::QString(__return_storage_ptr__,"IL Library");
      }
    }
    else {
      QString::QString(__return_storage_ptr__,"32-bit required");
    }
  }
  else {
    QString::QString(__return_storage_ptr__,"IL Only");
  }
  return __return_storage_ptr__;
}

Assistant:

QString ClrDirWrapper::translateFlag(DWORD flags)
{
    if (flags & pe::COMIMAGE_FLAGS_ILONLY) {
        return ("IL Only");
    }
    if (flags & pe::COMIMAGE_FLAGS_32BITREQUIRED) {
        return("32-bit required");
    }
    if (flags & pe::COMIMAGE_FLAGS_IL_LIBRARY) {
        return ("IL Library");
    }
    if (flags & pe::COMIMAGE_FLAGS_STRONGNAMESIGNED) {
        return("Strong Name Signed");
    }
    if (flags & pe::COMIMAGE_FLAGS_NATIVE_ENTRYPOINT) {
        return("Native EntryPoint");
    }
    if (flags & pe::COMIMAGE_FLAGS_TRACKDEBUGDATA) {
        return("Track Debug Data");
    }
    return "";
}